

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_modAdd(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                    wordcount_t num_words)

{
  cmpresult_t cVar1;
  uECC_word_t uVar2;
  uECC_word_t carry;
  wordcount_t num_words_local;
  uECC_word_t *mod_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  uVar2 = uECC_vli_add(result,left,right,num_words);
  if ((uVar2 == 0) && (cVar1 = uECC_vli_cmp_unsafe(mod,result,num_words), cVar1 == '\x01')) {
    return;
  }
  uECC_vli_sub(result,result,mod,num_words);
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modAdd(uECC_word_t *result,
                                  const uECC_word_t *left,
                                  const uECC_word_t *right,
                                  const uECC_word_t *mod,
                                  wordcount_t num_words) {
    uECC_word_t carry = uECC_vli_add(result, left, right, num_words);
    if (carry || uECC_vli_cmp_unsafe(mod, result, num_words) != 1) {
        /* result > mod (result = mod + remainder), so subtract mod to get remainder. */
        uECC_vli_sub(result, result, mod, num_words);
    }
}